

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

void __thiscall
Glucose::vec<Glucose::vec<Glucose::Solver::Watcher>_>::capacity
          (vec<Glucose::vec<Glucose::Solver::Watcher>_> *this,int min_cap)

{
  uint uVar1;
  vec<Glucose::Solver::Watcher> *pvVar2;
  int *piVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = this->cap;
  if ((int)uVar1 < min_cap) {
    uVar6 = (min_cap - uVar1) + 1 & 0xfffffffe;
    uVar5 = ((int)uVar1 >> 1 & 0xfffffffeU) + 2;
    if ((int)uVar5 <= (int)uVar6) {
      uVar5 = uVar6;
    }
    if ((int)(uVar1 ^ 0x7fffffff) < (int)uVar5) {
LAB_00110be7:
      uVar4 = __cxa_allocate_exception(1);
      __cxa_throw(uVar4,&OutOfMemoryException::typeinfo,0);
    }
    this->cap = uVar5 + uVar1;
    pvVar2 = (vec<Glucose::Solver::Watcher> *)realloc(this->data,(long)(int)(uVar5 + uVar1) << 4);
    this->data = pvVar2;
    if (pvVar2 == (vec<Glucose::Solver::Watcher> *)0x0) {
      piVar3 = __errno_location();
      if (*piVar3 == 0xc) goto LAB_00110be7;
    }
  }
  return;
}

Assistant:

void vec<T>::capacity(int min_cap) {
    if (cap >= min_cap) return;
    int add = imax((min_cap - cap + 1) & ~1, ((cap >> 1) + 2) & ~1);   // NOTE: grow by approximately 3/2
    if (add > INT_MAX - cap || ((data = (T*)::realloc(data, (cap += add) * sizeof(T))) == NULL) && errno == ENOMEM)
        throw OutOfMemoryException();
 }